

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  ImVec2 *lhs;
  float fVar5;
  ImGuiCol local_b4;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImU32 local_78;
  byte local_73;
  bool local_72;
  bool local_71;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *padding_local;
  ImVec2 *uv1_local;
  ImVec2 *uv0_local;
  ImVec2 *size_local;
  ImTextureID texture_id_local;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  bb.Max = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)bb.Max + 0x93) & 1U) == 0) {
    lhs = (ImVec2 *)((long)bb.Max + 0xd8);
    local_68 = ::operator+(lhs,size);
    _col = ::operator*(padding,2.0);
    local_60 = ::operator+(&local_68,(ImVec2 *)&col);
    ImRect::ImRect((ImRect *)local_58,lhs,&local_60);
    ItemSize((ImRect *)local_58,-1.0);
    bVar3 = ItemAdd((ImRect *)local_58,id,(ImRect *)0x0,0);
    if (bVar3) {
      local_73 = ButtonBehavior((ImRect *)local_58,id,&local_71,&local_72,0);
      if (((local_72 & 1U) == 0) || ((local_71 & 1U) == 0)) {
        local_b4 = 0x15;
        if ((local_71 & 1U) != 0) {
          local_b4 = 0x16;
        }
      }
      else {
        local_b4 = 0x17;
      }
      local_78 = GetColorU32(local_b4,1.0);
      RenderNavHighlight((ImRect *)local_58,id,1);
      IVar4 = local_78;
      local_80.x = (float)local_58._0_4_;
      local_80.y = (float)local_58._4_4_;
      local_88 = bb.Min;
      fVar5 = ImMin<float>(padding->x,padding->y);
      fVar5 = ImClamp<float>(fVar5,0.0,(pIVar2->Style).FrameRounding);
      RenderFrame(local_80,local_88,IVar4,true,fVar5);
      if (0.0 < bg_col->w) {
        pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
        local_90 = ::operator+((ImVec2 *)local_58,padding);
        local_98 = operator-(&bb.Min,padding);
        IVar4 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar1,&local_90,&local_98,IVar4,0.0,0);
      }
      pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
      local_a0 = ::operator+((ImVec2 *)local_58,padding);
      local_a8 = operator-(&bb.Min,padding);
      IVar4 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar1,texture_id,&local_a0,&local_a8,uv0,uv1,IVar4);
      texture_id_local._7_1_ = (bool)(local_73 & 1);
    }
    else {
      texture_id_local._7_1_ = false;
    }
  }
  else {
    texture_id_local._7_1_ = false;
  }
  return texture_id_local._7_1_;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}